

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O2

void __thiscall
amrex::MLEBABecLap::interpolation
          (MLEBABecLap *this,int amrlev,int fmglev,MultiFab *fine,MultiFab *crse)

{
  long lVar1;
  uint uVar2;
  FabType FVar3;
  EBFArrayBoxFactory *this_00;
  int *piVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint32_t *puVar11;
  int iVar12;
  FabArray<amrex::EBCellFlagFab> *local_1d0;
  long local_1c8;
  long local_1c0;
  Box local_184;
  FabArray<amrex::FArrayBox> *local_168;
  ulong local_160;
  long local_158;
  Array4<double> local_150;
  Array4<const_double> local_110;
  MFIter mfi;
  Array4<const_amrex::EBCellFlag> local_70;
  
  lVar10 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory
                               .
                               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    + (long)fmglev * 8);
  local_168 = &crse->super_FabArray<amrex::FArrayBox>;
  if (lVar10 == 0) {
    local_1d0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_1d0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    this_00 = (EBFArrayBoxFactory *)
              __dynamic_cast(lVar10,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
    if (this_00 != (EBFArrayBoxFactory *)0x0) {
      local_1d0 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
    }
  }
  uVar2 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])(this);
  MFIter::MFIter(&mfi,(FabArrayBase *)fine,true);
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  local_160 = (ulong)uVar2;
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      MFIter::~MFIter(&mfi);
      return;
    }
    MFIter::tilebox(&local_184,&mfi);
    if (local_1d0 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,local_168,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_150,&fine->super_FabArray<amrex::FArrayBox>,&mfi);
LAB_0057af22:
      local_1c0 = 0;
      for (uVar8 = 0; lVar10 = (long)local_184.smallend.vect[2], uVar8 != local_160;
          uVar8 = uVar8 + 1) {
        for (; (int)lVar10 <= local_184.bigend.vect[2]; lVar10 = lVar10 + 1) {
          pdVar6 = (double *)
                   ((long)local_150.p +
                   local_150.nstride * local_1c0 +
                   ((long)local_184.smallend.vect[1] - (long)local_150.begin.y) *
                   local_150.jstride * 8 + (lVar10 - local_150.begin.z) * local_150.kstride * 8 +
                   (long)local_150.begin.x * -8 + (long)local_184.smallend.vect[0] * 8);
          for (lVar5 = (long)local_184.smallend.vect[1]; lVar5 <= local_184.bigend.vect[1];
              lVar5 = lVar5 + 1) {
            if (local_184.smallend.vect[0] <= local_184.bigend.vect[0]) {
              pdVar7 = pdVar6;
              iVar12 = local_184.smallend.vect[0];
              do {
                *pdVar7 = local_110.p
                          [((long)((int)lVar10 >> 1) - (long)local_110.begin.z) * local_110.kstride
                           + local_110.nstride * uVar8 +
                             ((long)((int)lVar5 >> 1) - (long)local_110.begin.y) * local_110.jstride
                             + ((long)(iVar12 >> 1) - (long)local_110.begin.x)] + *pdVar7;
                iVar12 = iVar12 + 1;
                pdVar7 = pdVar7 + 1;
              } while (local_184.bigend.vect[0] + 1U != iVar12);
            }
            pdVar6 = pdVar6 + local_150.jstride;
          }
        }
        local_1c0 = local_1c0 + 8;
      }
    }
    else {
      piVar4 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar4 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      FVar3 = EBCellFlagFab::getType
                        ((local_1d0->m_fabs_v).
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar4],&local_184);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,local_168,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_150,&fine->super_FabArray<amrex::FArrayBox>,&mfi);
      if (FVar3 == singlevalued) {
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_70,local_1d0,&mfi);
        local_158 = (long)local_184.smallend.vect[2];
        local_1c8 = 0;
        for (uVar8 = 0; lVar10 = local_158, uVar8 != local_160; uVar8 = uVar8 + 1) {
          for (; (int)lVar10 <= local_184.bigend.vect[2]; lVar10 = lVar10 + 1) {
            puVar11 = (uint32_t *)
                      ((long)&local_70.p
                              [(long)local_184.smallend.vect[0] +
                               ((lVar10 - local_70.begin.z) * local_70.kstride -
                               (long)local_70.begin.x)].flag +
                      ((long)local_184.smallend.vect[1] - (long)local_70.begin.y) *
                      local_70.jstride * 4);
            for (lVar5 = (long)local_184.smallend.vect[1]; lVar5 <= local_184.bigend.vect[1];
                lVar5 = lVar5 + 1) {
              if (local_184.smallend.vect[0] <= local_184.bigend.vect[0]) {
                lVar1 = local_150.nstride * local_1c8 +
                        (lVar10 - local_150.begin.z) * local_150.kstride * 8 +
                        (lVar5 - local_150.begin.y) * local_150.jstride * 8 +
                        (long)local_150.begin.x * -8 + (long)local_184.smallend.vect[0] * 8;
                lVar9 = 0;
                do {
                  if ((~puVar11[lVar9] & 3) != 0) {
                    *(double *)((long)local_150.p + lVar9 * 8 + lVar1) =
                         local_110.p
                         [((long)((int)lVar5 >> 1) - (long)local_110.begin.y) * local_110.jstride +
                          ((long)((int)lVar10 >> 1) - (long)local_110.begin.z) * local_110.kstride +
                          local_110.nstride * uVar8 +
                          ((long)(local_184.smallend.vect[0] + (int)lVar9 >> 1) -
                          (long)local_110.begin.x)] +
                         *(double *)((long)local_150.p + lVar9 * 8 + lVar1);
                  }
                  lVar9 = lVar9 + 1;
                } while (~local_184.bigend.vect[0] + local_184.smallend.vect[0] + (int)lVar9 != 0);
              }
              puVar11 = puVar11 + local_70.jstride;
            }
          }
          local_1c8 = local_1c8 + 8;
        }
      }
      else if (FVar3 == regular) goto LAB_0057af22;
    }
    MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void
MLEBABecLap::interpolation (int amrlev, int fmglev, MultiFab& fine, const MultiFab& crse) const
{
    BL_PROFILE("MLEBABecLap::interpolation()");

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][fmglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const int ncomp = getNComp();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;

        Array4<Real const> const& cfab = crse.const_array(mfi);
        Array4<Real> const& ffab = fine.array(mfi);

        if (fabtyp == FabType::regular)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                int ic = amrex::coarsen(i,2);
                int jc = amrex::coarsen(j,2);
                int kc = amrex::coarsen(k,2);
                ffab(i,j,k,n) += cfab(ic,jc,kc,n);
            });
        }
        else if (fabtyp == FabType::singlevalued)
        {
            Array4<EBCellFlag const> const& flg = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (!flg(i,j,k).isCovered()) {
                    int ic = amrex::coarsen(i,2);
                    int jc = amrex::coarsen(j,2);
                    int kc = amrex::coarsen(k,2);
                    ffab(i,j,k,n) += cfab(ic,jc,kc,n);
                }
            });
        }
    }
}